

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

bool __thiscall
vkt::sr::(anonymous_namespace)::TextureGatherInstance::
verify<tcu::TextureCubeView,tcu::Vector<float,3>>
          (TextureGatherInstance *this,ConstPixelBufferAccess *rendered,TextureCubeView *texture,
          Vector<float,_3> (*texCoords) [4],GatherArgs *gatherArgs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  GatherType gatherType;
  WrapMode WVar5;
  ChannelOrder CVar6;
  uint uVar7;
  PixelOffsets *pPVar8;
  bool bVar9;
  int i;
  VkPhysicalDeviceProperties *pVVar10;
  long lVar11;
  ulong uVar12;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  ulong uVar13;
  ConstPixelBufferAccess *pCVar14;
  Surface *pSVar15;
  WrapMode WVar16;
  int iVar17;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  byte bVar18;
  int iVar19;
  uint uVar20;
  undefined8 data;
  int px;
  ChannelOrder CVar21;
  int componentNdx;
  int px_1;
  ChannelOrder CVar22;
  int iVar23;
  undefined1 auVar25 [12];
  undefined1 auVar24 [16];
  Vector<float,_3> VVar26;
  Vec2 viewportCoord;
  Vector<bool,_4> res_12;
  Vector<bool,_4> res_11;
  Vector<bool,_4> res_4;
  Vector<float,_3> texCoord;
  Surface ideal;
  Surface errorMask_1;
  Surface errorMask;
  Vec4 resultPix;
  Vector<int,_4> res;
  Vec4 idealPix;
  TextureLevel ideal_1;
  MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
  pixelOffsets;
  PixelBufferAccess idealAccess;
  Sampler sampler;
  IVec4 colorBits;
  undefined1 local_348 [8];
  TextureFormat TStack_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  uint local_320;
  byte local_31c [4];
  TestLog *local_318;
  float local_310;
  byte local_30c [4];
  string local_308;
  float local_2dc;
  undefined1 local_2d8 [8];
  TextureFormat local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 local_2b0 [8];
  ConstPixelBufferAccess *local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  ConstPixelBufferAccess *local_290;
  undefined8 local_288;
  void *local_280;
  void *local_278;
  undefined1 local_270 [8];
  void *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  Sampler *local_250;
  undefined1 local_248 [144];
  LogImage local_1b8;
  undefined1 local_128 [8];
  ConstPixelBufferAccess *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  TextureLevel local_100;
  Vector<float,_3> (*local_d8) [4];
  MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
  local_d0;
  float local_bc;
  undefined1 local_b8 [24];
  TextureFormat local_a0;
  TextureFormat TStack_98;
  BVec4 local_90;
  Sampler local_88;
  IVec4 local_48;
  
  local_318 = (*(Context **)(this + 8))->m_testCtx->m_log;
  gatherType = *(GatherType *)(this + 0x210);
  iVar23 = *(int *)(this + 0x214);
  local_290 = rendered;
  local_250 = (Sampler *)texture;
  local_d8 = texCoords;
  pVVar10 = Context::getDeviceProperties(*(Context **)(this + 8));
  if (iVar23 == 2) {
    local_1b8.m_name._M_dataplus._M_p = *(pointer *)&(pVVar10->limits).minTexelGatherOffset;
  }
  else if (iVar23 == 1) {
    local_1b8.m_name._M_dataplus._M_p = (pointer)0x7fffffff8;
  }
  else if (iVar23 == 0) {
    local_1b8.m_name._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    local_1b8.m_name._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  }
  sr::anon_unknown_0::makePixelOffsetsFunctor(&local_d0,gatherType,gatherArgs,(IVec2 *)&local_1b8);
  pPVar8 = local_d0.
           super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
           .m_data.ptr;
  local_248._0_4_ = RGBA;
  local_248._4_4_ = UNORM_SHORT_565;
  local_248._8_8_ = (ConstPixelBufferAccess *)0x800000008;
  local_1b8.m_name._M_dataplus._M_p = (pointer)0x0;
  local_1b8.m_name._M_string_length._0_4_ = R;
  local_1b8.m_name._M_string_length._4_4_ = SNORM_INT8;
  lVar11 = 0;
  do {
    *(int *)((long)(&local_1b8.m_access.m_size + -6) + lVar11 * 4) =
         *(int *)(local_248 + lVar11 * 4) + -1;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  local_88.wrapS = CLAMP_TO_EDGE;
  local_88.wrapT = CLAMP_TO_EDGE;
  local_88.wrapR = CLAMP_TO_EDGE;
  local_88.minFilter = NEAREST;
  local_48.m_data[0] = 0;
  local_48.m_data[1] = 0;
  local_48.m_data[2] = 0;
  local_48.m_data[3] = 0;
  lVar11 = 0;
  do {
    WVar5 = *(WrapMode *)((long)(&local_1b8.m_access.m_size + -6) + lVar11 * 4);
    WVar16 = (&local_88.wrapS)[lVar11];
    if ((int)(&local_88.wrapS)[lVar11] < (int)WVar5) {
      WVar16 = WVar5;
    }
    local_48.m_data[lVar11] = WVar16;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  uVar12 = (ulong)*(uint *)(this + 0x250);
  iVar19 = -1;
  CVar22 = ~R;
  iVar23 = -1;
  if (uVar12 < 3) {
    CVar22 = *(ChannelOrder *)(&DAT_00b54910 + uVar12 * 4);
    iVar23 = *(int *)(&DAT_00b5491c + uVar12 * 4);
  }
  iVar17 = -1;
  if (*(uint *)(this + 0x250) < 3) {
    iVar19 = *(int *)(&DAT_00b54928 + uVar12 * 4);
    iVar17 = *(int *)(&DAT_00b54934 + uVar12 * 4);
  }
  local_88.wrapR = WRAPMODE_LAST;
  local_88.minFilter = FILTERMODE_LAST;
  local_88.magFilter = FILTERMODE_LAST;
  local_88.lodThreshold = 0.0;
  local_88.normalizedCoords = true;
  local_88.depthStencilMode = MODE_DEPTH;
  local_88.borderColor.v.uData[0]._0_1_ = 0;
  local_88.borderColor.v._1_7_ = 0;
  local_88.borderColor.v.uData[2]._0_1_ = 0;
  local_88._45_8_ = 0;
  local_88._0_8_ = *(undefined8 *)(this + 0x224);
  local_88.compareChannel = 0;
  local_88.compare = *(uint *)(this + 0x220);
  if ((*(int *)(this + 0x218) == 0x14) || (*(int *)(this + 0x218) == 0x12)) {
    lVar11 = 0;
    do {
      local_100.m_size.m_data[lVar11 + -2] = 0x16;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar11 = 3;
    do {
      local_100.m_size.m_data[lVar11 + -2] = 0x10;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
    local_100.m_data.m_ptr = (void *)0x1000000010;
    local_100.m_data.m_cap._0_4_ = 7;
    local_288 = &PTR_operator___00d5c660;
    local_280 = (void *)0x4000000040;
    CVar6 = (local_290->m_size).m_data[0];
    local_100.m_format.order = CVar22;
    local_100.m_format.type = CVar22;
    local_100.m_size.m_data[0] = iVar23;
    local_100.m_size.m_data[1] = iVar19;
    local_100.m_size.m_data[2] = iVar19;
    local_100._20_4_ = iVar17;
    tcu::Surface::Surface((Surface *)local_2b0,CVar6,CVar6);
    local_1b8.m_name._M_dataplus._M_p = (pointer)0x300000008;
    pCVar14 = (ConstPixelBufferAccess *)
              CONCAT26(local_2a0._M_allocated_capacity._6_2_,local_2a0._M_allocated_capacity._0_6_);
    if ((ConstPixelBufferAccess *)
        CONCAT26(local_2a0._M_allocated_capacity._6_2_,local_2a0._M_allocated_capacity._0_6_) !=
        (ConstPixelBufferAccess *)0x0) {
      pCVar14 = local_2a8;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_b8,(TextureFormat *)&local_1b8,local_2b0._0_4_,
               local_2b0._4_4_,1,pCVar14);
    tcu::Surface::Surface((Surface *)local_270,CVar6,CVar6);
    local_248._0_4_ = RGBA;
    local_248._4_4_ = UNORM_INT8;
    data = local_260._M_allocated_capacity;
    if ((void *)local_260._M_allocated_capacity != (void *)0x0) {
      data = local_268;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_1b8,(TextureFormat *)local_248,local_270._0_4_,
               local_270._4_4_,1,(void *)data);
    local_128._0_4_ = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)local_248);
    tcu::clear((PixelBufferAccess *)&local_1b8,(Vec4 *)local_248);
    if ((int)CVar6 < 1) {
      uVar20 = 1;
    }
    else {
      local_bc = (float)(int)CVar6;
      local_320 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      CVar22 = R;
      do {
        local_2dc = (float)(int)CVar22;
        CVar21 = R;
        do {
          local_1b8.m_name.field_2._M_allocated_capacity = 0;
          local_1b8.m_name.field_2._8_8_ = 0;
          local_1b8.m_name._M_dataplus._M_p = (pointer)0x0;
          local_1b8.m_name._M_string_length._0_4_ = R;
          local_1b8.m_name._M_string_length._4_4_ = SNORM_INT8;
          local_248._4_4_ = CVar22;
          local_248._0_4_ = CVar21;
          (**pPVar8->_vptr_PixelOffsets)(pPVar8,(ConstPixelBufferAccess *)local_248,&local_1b8);
          local_128._4_4_ = local_2dc;
          local_128._0_4_ = (float)(int)CVar21;
          local_248._0_4_ = R;
          local_248._4_4_ = SNORM_INT8;
          lVar11 = 0;
          do {
            *(float *)(local_248 + lVar11 * 4) = *(float *)(local_128 + lVar11 * 4) + 0.5;
            lVar11 = lVar11 + 1;
          } while (lVar11 == 1);
          local_2d8._4_4_ = local_bc;
          local_2d8._0_4_ = local_bc;
          local_348._0_4_ = R;
          local_348._4_4_ = SNORM_INT8;
          lVar11 = 0;
          do {
            *(float *)(local_348 + lVar11 * 4) =
                 *(float *)(local_248 + lVar11 * 4) / *(float *)(local_2d8 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (lVar11 == 1);
          auVar25 = (undefined1  [12])0x0;
          VVar26 = triQuadInterpolate<tcu::Vector<float,3>>
                             ((_anonymous_namespace_ *)local_2d8,local_d8,(float)local_348._0_4_,
                              (float)local_348._4_4_);
          auVar24._0_4_ = VVar26.m_data[2];
          auVar24._4_12_ = auVar25;
          local_248._4_4_ = CVar22;
          local_248._0_4_ = CVar21;
          local_310 = (float)(*(code *)*local_288)
                                       (VVar26.m_data[0],auVar24._0_8_,&local_288,
                                        (ConstPixelBufferAccess *)local_248);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_248,(int)local_290,CVar21,CVar22);
          tcu::TextureCubeView::gatherCompare
                    ((TextureCubeView *)local_128,local_250,local_310,(float)local_2d8._0_4_,
                     (float)local_2d8._4_4_,(float)local_2d0.order);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_b8,(Vec4 *)local_128,CVar21,CVar22,0);
          local_308._M_dataplus._M_p = local_308._M_dataplus._M_p & 0xffffffff00000000;
          lVar11 = 0;
          do {
            *(bool *)((long)&local_308._M_dataplus._M_p + lVar11) =
                 *(float *)(local_248 + lVar11 * 4) == *(float *)(local_128 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          if ((char)local_308._M_dataplus._M_p == '\0') {
LAB_0066a35c:
            bVar9 = tcu::isGatherCompareResultValid
                              ((TextureCubeView *)local_250,&local_88,
                               (TexComparePrecision *)&local_100,(Vec3 *)local_2d8,local_310,
                               (Vec4 *)local_248);
            if (!bVar9) {
              *(undefined4 *)((long)local_268 + (long)(int)(local_270._0_4_ * CVar22 + CVar21) * 4)
                   = 0xff0000ff;
              local_320 = 0;
            }
          }
          else {
            uVar12 = 0xffffffffffffffff;
            do {
              if (uVar12 == 2) {
                uVar13 = 3;
                break;
              }
              uVar13 = uVar12 + 1;
              lVar11 = uVar12 + 2;
              uVar12 = uVar13;
            } while (*(char *)((long)&local_308._M_dataplus._M_p + lVar11) != '\0');
            if (uVar13 < 3) goto LAB_0066a35c;
          }
          CVar21 = CVar21 + A;
        } while (CVar21 != CVar6);
        CVar22 = CVar22 + A;
        uVar20 = local_320;
      } while (CVar22 != CVar6);
    }
    bVar18 = (byte)uVar20;
    local_118._M_allocated_capacity = 0x6552796669726556;
    local_118._8_4_ = 0x746c7573;
    local_120 = (ConstPixelBufferAccess *)0xc;
    local_118._M_local_buf[0xc] = '\0';
    local_2d8 = (undefined1  [8])&local_2c8;
    local_1b8.m_name._M_dataplus._M_p = (pointer)0x13;
    local_128 = (undefined1  [8])&local_118;
    local_2d8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_2d8,(ulong)&local_1b8);
    local_2c8._M_allocated_capacity = (size_type)local_1b8.m_name._M_dataplus._M_p;
    *(undefined8 *)local_2d8 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_2d8 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_2d8 + 0xf),"sult",4);
    local_2d0 = (TextureFormat)local_1b8.m_name._M_dataplus._M_p;
    *(char *)((long)local_2d8 + (long)local_1b8.m_name._M_dataplus._M_p) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_248,(string *)local_128,(string *)local_2d8);
    tcu::TestLog::startImageSet(local_318,(char *)local_248._0_8_,(char *)local_248._32_8_);
    local_338._M_allocated_capacity = 0x64657265646e6552;
    TStack_340.order = RGBA;
    TStack_340.type = SNORM_INT8;
    local_338._8_2_ = (ushort)(byte)local_338._M_local_buf[9] << 8;
    paVar1 = &local_308.field_2;
    local_308.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_308.field_2._M_allocated_capacity._6_2_ = 0x6465;
    local_308.field_2._M_local_buf[8] = ' ';
    local_308.field_2._M_local_buf[9] = 'i';
    local_308.field_2._10_4_ = 0x6567616d;
    local_308._M_string_length._0_4_ = sRGB;
    local_308._M_string_length._4_4_ = SNORM_INT8;
    local_308.field_2._M_local_buf[0xe] = '\0';
    pCVar14 = local_290;
    local_348 = (undefined1  [8])&local_338;
    local_308._M_dataplus._M_p = (pointer)paVar1;
    tcu::LogImage::LogImage
              (&local_1b8,(string *)local_348,&local_308,local_290,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_1b8,(int)local_318,__buf,(size_t)pCVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.m_description._M_dataplus._M_p != &local_1b8.m_description.field_2) {
      operator_delete(local_1b8.m_description._M_dataplus._M_p,
                      local_1b8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.m_name._M_dataplus._M_p != &local_1b8.m_name.field_2) {
      operator_delete(local_1b8.m_name._M_dataplus._M_p,
                      local_1b8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != paVar1) {
      operator_delete(local_308._M_dataplus._M_p,
                      CONCAT26(local_308.field_2._M_allocated_capacity._6_2_,
                               local_308.field_2._M_allocated_capacity._0_6_) + 1);
    }
    if (local_348 != (undefined1  [8])&local_338) {
      operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
    }
    if ((ConstPixelBufferAccess *)local_248._32_8_ != (ConstPixelBufferAccess *)(local_248 + 0x30))
    {
      operator_delete((void *)local_248._32_8_,(ulong)(local_248._48_8_ + 1));
    }
    if (local_248._0_8_ != (long)local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
    }
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,(ulong)(local_118._M_allocated_capacity + 1));
    }
    if ((uVar20 & 1) == 0) {
      local_118._M_allocated_capacity = 0x636e657265666552;
      local_118._8_2_ = 0x65;
      local_120 = (ConstPixelBufferAccess *)0x9;
      local_2d8 = (undefined1  [8])&local_2c8;
      local_248._0_4_ = CHANNELORDER_LAST;
      local_248._4_4_ = SNORM_INT8;
      local_128 = (undefined1  [8])&local_118;
      local_2d8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_2d8,(ulong)local_248);
      local_2c8._M_allocated_capacity = local_248._0_8_;
      *(undefined8 *)local_2d8 = 0x6572206c61656449;
      builtin_strncpy((char *)((long)local_2d8 + 8),"ference ",8);
      builtin_strncpy((char *)((long)local_2d8 + 0xd),"ce image",8);
      local_2d0.order = local_248._0_4_;
      local_2d0.type = local_248._4_4_;
      *(char *)((long)local_2d8 + local_248._0_8_) = '\0';
      pSVar15 = (Surface *)local_2b0;
      tcu::LogImage::LogImage
                (&local_1b8,(string *)local_128,(string *)local_2d8,pSVar15,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_1b8,(int)local_318,__buf_00,(size_t)pSVar15);
      local_338._M_allocated_capacity = 0x73614d726f727245;
      local_338._8_2_ = 0x6b;
      TStack_340.order = ARGB;
      TStack_340.type = SNORM_INT8;
      local_308.field_2._M_allocated_capacity._0_6_ = 0x20726f727245;
      local_308.field_2._M_allocated_capacity._6_2_ = 0x616d;
      local_308.field_2._M_local_buf[8] = 's';
      local_308.field_2._M_local_buf[9] = 'k';
      local_308._M_string_length._0_4_ = BGR;
      local_308._M_string_length._4_4_ = SNORM_INT8;
      local_308.field_2._10_4_ = local_308.field_2._10_4_ & 0xffffff00;
      pSVar15 = (Surface *)local_270;
      local_348 = (undefined1  [8])&local_338;
      local_308._M_dataplus._M_p = (pointer)paVar1;
      tcu::LogImage::LogImage
                ((LogImage *)local_248,(string *)local_348,&local_308,pSVar15,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_248,(int)local_318,__buf_01,(size_t)pSVar15);
      if ((ConstPixelBufferAccess *)local_248._32_8_ != (ConstPixelBufferAccess *)(local_248 + 0x30)
         ) {
        operator_delete((void *)local_248._32_8_,(ulong)(local_248._48_8_ + 1));
      }
      if (local_248._0_8_ != (long)local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != paVar1) {
        operator_delete(local_308._M_dataplus._M_p,
                        CONCAT26(local_308.field_2._M_allocated_capacity._6_2_,
                                 local_308.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_348 != (undefined1  [8])&local_338) {
        operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.m_description._M_dataplus._M_p != &local_1b8.m_description.field_2) {
        operator_delete(local_1b8.m_description._M_dataplus._M_p,
                        local_1b8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.m_name._M_dataplus._M_p != &local_1b8.m_name.field_2) {
        operator_delete(local_1b8.m_name._M_dataplus._M_p,
                        local_1b8.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_2d8 != (undefined1  [8])&local_2c8) {
        operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
      }
      if (local_128 != (undefined1  [8])&local_118) {
        operator_delete((void *)local_128,(ulong)(local_118._M_allocated_capacity + 1));
      }
    }
    tcu::TestLog::endImageSet(local_318);
    tcu::Surface::~Surface((Surface *)local_270);
    tcu::Surface::~Surface((Surface *)local_2b0);
    goto LAB_0066b9ff;
  }
  componentNdx = 0;
  if (0 < gatherArgs->componentNdx) {
    componentNdx = gatherArgs->componentNdx;
  }
  uVar20 = *(uint *)(this + 0x21c);
  uVar12 = (ulong)uVar20;
  if (uVar12 < 0x22) {
    if ((0x58UL >> (uVar12 & 0x3f) & 1) == 0) {
      if ((0x2c0000000U >> (uVar12 & 0x3f) & 1) == 0) goto LAB_0066b55d;
      goto LAB_0066a412;
    }
    lVar11 = 0;
    do {
      *(undefined4 *)(local_b8 + lVar11 * 4) = 0x16;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar11 = 3;
    do {
      *(undefined4 *)(local_b8 + lVar11 * 4) = 0x10;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
    local_a0.order = R;
    local_a0.type = SNORM_INT8;
    TStack_98 = (TextureFormat)0x0;
    local_90.m_data[0] = true;
    local_90.m_data[1] = true;
    local_90.m_data[2] = true;
    local_90.m_data[3] = true;
    tcu::computeFixedPointThreshold((tcu *)&local_1b8,&local_48);
    pPVar8 = local_d0.
             super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
             .m_data.ptr;
    local_a0 = (TextureFormat)local_1b8.m_name._M_dataplus._M_p;
    TStack_98.order = (undefined4)local_1b8.m_name._M_string_length;
    TStack_98.type = local_1b8.m_name._M_string_length._4_4_;
    local_90.m_data[0] = true;
    local_90.m_data[1] = true;
    local_90.m_data[2] = true;
    local_90.m_data[3] = true;
    CVar6 = (local_290->m_size).m_data[0];
    local_b8._0_4_ = CVar22;
    local_b8._4_4_ = CVar22;
    local_b8._8_4_ = iVar23;
    local_b8._12_4_ = iVar19;
    local_b8._16_4_ = iVar19;
    local_b8._20_4_ = iVar17;
    tcu::TextureLevel::TextureLevel(&local_100,&local_290->m_format,CVar6,CVar6,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_128,&local_100);
    tcu::Surface::Surface((Surface *)&local_288,CVar6,CVar6);
    local_248._0_4_ = RGBA;
    local_248._4_4_ = UNORM_INT8;
    if (local_278 != (void *)0x0) {
      local_278 = local_280;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_1b8,(TextureFormat *)local_248,(int)local_288,
               local_288._4_4_,1,local_278);
    local_2d8._0_4_ = -1.7146522e+38;
    tcu::RGBA::toVec((RGBA *)local_248);
    tcu::clear((PixelBufferAccess *)&local_1b8,(Vec4 *)local_248);
    if ((int)CVar6 < 1) {
      uVar20 = 1;
    }
    else {
      local_2dc = (float)(int)CVar6;
      local_320 = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
      CVar22 = R;
      do {
        local_310 = (float)(int)CVar22;
        CVar21 = R;
        do {
          local_1b8.m_name.field_2._M_allocated_capacity = 0;
          local_1b8.m_name.field_2._8_8_ = 0;
          local_1b8.m_name._M_dataplus._M_p = (pointer)0x0;
          local_1b8.m_name._M_string_length._0_4_ = R;
          local_1b8.m_name._M_string_length._4_4_ = SNORM_INT8;
          local_248._4_4_ = CVar22;
          local_248._0_4_ = CVar21;
          (**pPVar8->_vptr_PixelOffsets)(pPVar8,(ConstPixelBufferAccess *)local_248,&local_1b8);
          local_2d8._4_4_ = local_310;
          local_2d8._0_4_ = (float)(int)CVar21;
          local_248._0_4_ = R;
          local_248._4_4_ = SNORM_INT8;
          lVar11 = 0;
          do {
            *(float *)(local_248 + lVar11 * 4) = *(float *)(local_2d8 + lVar11 * 4) + 0.5;
            lVar11 = lVar11 + 1;
          } while (lVar11 == 1);
          local_348._4_4_ = local_2dc;
          local_348._0_4_ = local_2dc;
          local_270 = (undefined1  [8])0x0;
          lVar11 = 0;
          do {
            *(float *)(local_270 + lVar11 * 4) =
                 *(float *)(local_248 + lVar11 * 4) / *(float *)(local_348 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (lVar11 == 1);
          triQuadInterpolate<tcu::Vector<float,3>>
                    ((_anonymous_namespace_ *)local_2b0,local_d8,(float)local_270._0_4_,
                     (float)local_270._4_4_);
          tcu::ConstPixelBufferAccess::getPixelT<float>
                    ((ConstPixelBufferAccess *)local_248,(int)local_290,CVar21,CVar22);
          tcu::TextureCubeView::gather
                    ((TextureCubeView *)local_2d8,local_250,(float)local_2b0._0_4_,
                     (float)local_2b0._4_4_,local_2a8._0_4_,(int)&local_88);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_128,(Vec4 *)local_2d8,CVar21,CVar22,0);
          local_348._0_4_ = R;
          local_348._4_4_ = SNORM_INT8;
          TStack_340.order = R;
          TStack_340.type = SNORM_INT8;
          lVar11 = 0;
          do {
            fVar3 = *(float *)(local_248 + lVar11 * 4);
            fVar4 = *(float *)(local_2d8 + lVar11 * 4);
            *(uint *)(local_348 + lVar11 * 4) =
                 ~-(uint)(fVar4 < fVar3) & (uint)(fVar4 - fVar3) |
                 (uint)(fVar3 - fVar4) & -(uint)(fVar4 < fVar3);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          local_308._M_dataplus._M_p = (pointer)local_a0;
          local_308._M_string_length._0_4_ = TStack_98.order;
          local_308._M_string_length._4_4_ = TStack_98.type;
          local_30c[0] = 0;
          local_30c[1] = 0;
          local_30c[2] = 0;
          local_30c[3] = 0;
          lVar11 = 0;
          do {
            pfVar2 = (float *)((long)&local_308._M_dataplus._M_p + lVar11 * 4);
            local_30c[lVar11] =
                 *pfVar2 <= *(float *)(local_348 + lVar11 * 4) &&
                 *(float *)(local_348 + lVar11 * 4) != *pfVar2;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          local_31c[0] = 0;
          local_31c[1] = 0;
          local_31c[2] = 0;
          local_31c[3] = 0;
          lVar11 = 0;
          do {
            local_31c[lVar11] = local_30c[lVar11] & local_90.m_data[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          if (local_31c[0] == 0) {
            uVar12 = 0xffffffffffffffff;
            do {
              if (uVar12 == 2) {
                uVar13 = 3;
                break;
              }
              uVar13 = uVar12 + 1;
              lVar11 = uVar12 + 2;
              uVar12 = uVar13;
            } while (local_31c[lVar11] != 1);
            if (uVar13 < 3) goto LAB_0066b06d;
          }
          else {
LAB_0066b06d:
            bVar9 = tcu::isGatherResultValid
                              ((TextureCubeView *)local_250,&local_88,(LookupPrecision *)local_b8,
                               (Vec3 *)local_2b0,componentNdx,(Vec4 *)local_248);
            if (!bVar9) {
              *(undefined4 *)((long)local_280 + (long)(int)((int)local_288 * CVar22 + CVar21) * 4) =
                   0xff0000ff;
              local_320 = 0;
            }
          }
          CVar21 = CVar21 + A;
        } while (CVar21 != CVar6);
        CVar22 = CVar22 + A;
        uVar20 = local_320;
      } while (CVar22 != CVar6);
    }
    bVar18 = (byte)uVar20;
    local_2c8._M_allocated_capacity._0_4_ = 0x69726556;
    local_2c8._M_allocated_capacity._4_4_ = 0x65527966;
    local_2c8._8_4_ = 0x746c7573;
    local_2d0.order = sR;
    local_2d0.type = SNORM_INT8;
    local_2c8._M_local_buf[0xc] = '\0';
    local_348 = (undefined1  [8])&local_338;
    local_1b8.m_name._M_dataplus._M_p = (pointer)0x13;
    local_2d8 = (undefined1  [8])&local_2c8;
    local_348 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_348,(ulong)&local_1b8);
    local_338._M_allocated_capacity = (size_type)local_1b8.m_name._M_dataplus._M_p;
    *(undefined8 *)local_348 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_348 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_348 + 0xf),"sult",4);
    TStack_340 = (TextureFormat)local_1b8.m_name._M_dataplus._M_p;
    *(char *)((long)local_348 + (long)local_1b8.m_name._M_dataplus._M_p) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_248,(string *)local_2d8,(string *)local_348);
    tcu::TestLog::startImageSet(local_318,(char *)local_248._0_8_,(char *)local_248._32_8_);
    paVar1 = &local_308.field_2;
    local_308.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_308.field_2._M_allocated_capacity._6_2_ = 0x6465;
    local_308._M_string_length._0_4_ = RGBA;
    local_308._M_string_length._4_4_ = SNORM_INT8;
    local_308.field_2._M_local_buf[8] = '\0';
    local_2a0._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_2a0._M_allocated_capacity._6_2_ = 0x6465;
    local_2a0._8_2_ = 0x6920;
    local_2a0._10_4_ = 0x6567616d;
    local_2a8 = (ConstPixelBufferAccess *)0xe;
    local_2a0._M_local_buf[0xe] = '\0';
    pCVar14 = local_290;
    local_308._M_dataplus._M_p = (pointer)paVar1;
    local_2b0 = (undefined1  [8])&local_2a0;
    tcu::LogImage::LogImage
              (&local_1b8,&local_308,(string *)local_2b0,local_290,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_1b8,(int)local_318,__buf_02,(size_t)pCVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.m_description._M_dataplus._M_p != &local_1b8.m_description.field_2) {
      operator_delete(local_1b8.m_description._M_dataplus._M_p,
                      local_1b8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.m_name._M_dataplus._M_p != &local_1b8.m_name.field_2) {
      operator_delete(local_1b8.m_name._M_dataplus._M_p,
                      local_1b8.m_name.field_2._M_allocated_capacity + 1);
    }
    if (local_2b0 != (undefined1  [8])&local_2a0) {
      operator_delete((void *)local_2b0,
                      CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                               local_2a0._M_allocated_capacity._0_6_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != paVar1) {
      operator_delete(local_308._M_dataplus._M_p,
                      CONCAT26(local_308.field_2._M_allocated_capacity._6_2_,
                               local_308.field_2._M_allocated_capacity._0_6_) + 1);
    }
    if ((ConstPixelBufferAccess *)local_248._32_8_ != (ConstPixelBufferAccess *)(local_248 + 0x30))
    {
      operator_delete((void *)local_248._32_8_,(ulong)(local_248._48_8_ + 1));
    }
    if (local_248._0_8_ != (long)local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    if (local_348 != (undefined1  [8])&local_338) {
      operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
    }
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
    }
    if ((uVar20 & 1) == 0) {
      local_348 = (undefined1  [8])&local_338;
      local_338._M_allocated_capacity = 0x636e657265666552;
      local_338._8_2_ = 0x65;
      TStack_340.order = ARGB;
      TStack_340.type = SNORM_INT8;
      local_248._0_4_ = CHANNELORDER_LAST;
      local_248._4_4_ = SNORM_INT8;
      local_308._M_dataplus._M_p = (pointer)paVar1;
      local_308._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_308,(ulong)local_248);
      local_308.field_2._M_allocated_capacity._0_6_ = (undefined6)local_248._0_8_;
      local_308.field_2._M_allocated_capacity._6_2_ = SUB82(local_248._0_8_,6);
      *(undefined8 *)local_308._M_dataplus._M_p = 0x6572206c61656449;
      builtin_strncpy((char *)((long)local_308._M_dataplus._M_p + 8),"ference ",8);
      builtin_strncpy((char *)((long)local_308._M_dataplus._M_p + 0xd),"ce image",8);
      local_308._M_string_length = local_248._0_8_;
      *(char *)((long)local_308._M_dataplus._M_p + local_248._0_8_) = '\0';
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_2d8,&local_100);
      pCVar14 = (ConstPixelBufferAccess *)local_2d8;
      tcu::LogImage::LogImage
                (&local_1b8,(string *)local_348,&local_308,pCVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_1b8,(int)local_318,__buf_03,(size_t)pCVar14);
      local_2a0._M_allocated_capacity._0_6_ = 0x4d726f727245;
      local_2a0._M_allocated_capacity._6_2_ = 0x7361;
      local_2a0._8_2_ = 0x6b;
      local_2a8 = (ConstPixelBufferAccess *)0x9;
      local_260._M_allocated_capacity = 0x616d20726f727245;
      local_260._8_2_ = 0x6b73;
      local_268 = (void *)0xa;
      local_260._M_local_buf[10] = '\0';
      pSVar15 = (Surface *)&local_288;
      local_2b0 = (undefined1  [8])&local_2a0;
      local_270 = (undefined1  [8])&local_260;
      tcu::LogImage::LogImage
                ((LogImage *)local_248,(string *)local_2b0,(string *)local_270,pSVar15,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_248,(int)local_318,__buf_04,(size_t)pSVar15);
      if ((ConstPixelBufferAccess *)local_248._32_8_ != (ConstPixelBufferAccess *)(local_248 + 0x30)
         ) {
        operator_delete((void *)local_248._32_8_,(ulong)(local_248._48_8_ + 1));
      }
      if (local_248._0_8_ != (long)local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
      }
      if (local_270 != (undefined1  [8])&local_260) {
        operator_delete((void *)local_270,local_260._M_allocated_capacity + 1);
      }
      if (local_2b0 != (undefined1  [8])&local_2a0) {
        operator_delete((void *)local_2b0,
                        CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                 local_2a0._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.m_description._M_dataplus._M_p != &local_1b8.m_description.field_2) {
        operator_delete(local_1b8.m_description._M_dataplus._M_p,
                        local_1b8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.m_name._M_dataplus._M_p != &local_1b8.m_name.field_2) {
        operator_delete(local_1b8.m_name._M_dataplus._M_p,
                        local_1b8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != paVar1) {
        operator_delete(local_308._M_dataplus._M_p,
                        CONCAT26(local_308.field_2._M_allocated_capacity._6_2_,
                                 local_308.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_348 != (undefined1  [8])&local_338) {
        operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
      }
    }
    tcu::TestLog::endImageSet(local_318);
  }
  else {
LAB_0066b55d:
    if (2 < uVar20 - 0x1b) {
LAB_0066bde6:
      bVar18 = 0;
      goto LAB_0066b9ff;
    }
LAB_0066a412:
    lVar11 = 0;
    do {
      *(undefined4 *)(local_b8 + lVar11 * 4) = 0x16;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar11 = 3;
    do {
      *(undefined4 *)(local_b8 + lVar11 * 4) = 0x10;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
    local_a0.order = R;
    local_a0.type = SNORM_INT8;
    TStack_98.order = R;
    TStack_98.type = SNORM_INT8;
    local_90.m_data[0] = true;
    local_90.m_data[1] = true;
    local_90.m_data[2] = true;
    local_90.m_data[3] = true;
    if ((uVar20 < 0x22) && ((0x2c0000000U >> ((ulong)uVar20 & 0x3f) & 1) != 0)) {
      CVar6 = (local_290->m_size).m_data[0];
      local_b8._0_4_ = CVar22;
      local_b8._4_4_ = CVar22;
      local_b8._8_4_ = iVar23;
      local_b8._12_4_ = iVar19;
      local_b8._16_4_ = iVar19;
      local_b8._20_4_ = iVar17;
      tcu::TextureLevel::TextureLevel(&local_100,&local_290->m_format,CVar6,CVar6,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_128,&local_100);
      tcu::Surface::Surface((Surface *)&local_288,CVar6,CVar6);
      local_248._0_4_ = RGBA;
      local_248._4_4_ = UNORM_INT8;
      if (local_278 != (void *)0x0) {
        local_278 = local_280;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_1b8,(TextureFormat *)local_248,(int)local_288,
                 local_288._4_4_,1,local_278);
      local_2d8._0_4_ = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)local_248);
      tcu::clear((PixelBufferAccess *)&local_1b8,(Vec4 *)local_248);
      if ((int)CVar6 < 1) {
        uVar20 = 1;
      }
      else {
        local_2dc = (float)(int)CVar6;
        local_320 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        CVar22 = R;
        do {
          local_310 = (float)(int)CVar22;
          CVar21 = R;
          do {
            local_1b8.m_name.field_2._M_allocated_capacity = 0;
            local_1b8.m_name.field_2._8_8_ = 0;
            local_1b8.m_name._M_dataplus._M_p = (pointer)0x0;
            local_1b8.m_name._M_string_length._0_4_ = R;
            local_1b8.m_name._M_string_length._4_4_ = SNORM_INT8;
            local_248._4_4_ = CVar22;
            local_248._0_4_ = CVar21;
            (**pPVar8->_vptr_PixelOffsets)(pPVar8,(TextureCubeView *)local_248,&local_1b8);
            local_2d8._4_4_ = local_310;
            local_2d8._0_4_ = (float)(int)CVar21;
            local_248._0_4_ = R;
            local_248._4_4_ = SNORM_INT8;
            lVar11 = 0;
            do {
              *(float *)(local_248 + lVar11 * 4) = *(float *)(local_2d8 + lVar11 * 4) + 0.5;
              lVar11 = lVar11 + 1;
            } while (lVar11 == 1);
            local_348._4_4_ = local_2dc;
            local_348._0_4_ = local_2dc;
            local_270 = (undefined1  [8])0x0;
            lVar11 = 0;
            do {
              *(float *)(local_270 + lVar11 * 4) =
                   *(float *)(local_248 + lVar11 * 4) / *(float *)(local_348 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 == 1);
            triQuadInterpolate<tcu::Vector<float,3>>
                      ((_anonymous_namespace_ *)local_2b0,local_d8,(float)local_270._0_4_,
                       (float)local_270._4_4_);
            tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                      ((ConstPixelBufferAccess *)local_2d8,(int)local_290,CVar21,CVar22);
            tcu::TextureCubeView::gather
                      ((TextureCubeView *)local_248,local_250,(float)local_2b0._0_4_,
                       (float)local_2b0._4_4_,local_2a8._0_4_,(int)&local_88);
            local_348._0_4_ = R;
            local_348._4_4_ = SNORM_INT8;
            TStack_340.order = R;
            TStack_340.type = SNORM_INT8;
            lVar11 = 0;
            do {
              *(int *)(local_348 + lVar11 * 4) = (int)(long)*(float *)(local_248 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            local_248._0_8_ = local_348;
            local_248._8_4_ = TStack_340.order;
            local_248._12_4_ = TStack_340.type;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_128,(IVec4 *)local_248,CVar21,CVar22,0);
            local_248._0_4_ = R;
            local_248._4_4_ = SNORM_INT8;
            local_248._8_8_ = (ConstPixelBufferAccess *)0x0;
            lVar11 = 0;
            do {
              uVar20 = *(uint *)(local_348 + lVar11 * 4);
              uVar7 = *(uint *)(local_2d8 + lVar11 * 4);
              iVar23 = uVar20 - uVar7;
              if (uVar20 < uVar7) {
                iVar23 = -(uVar20 - uVar7);
              }
              *(int *)(local_248 + lVar11 * 4) = iVar23;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            local_308._M_dataplus._M_p = (pointer)local_a0;
            local_308._M_string_length._0_4_ = TStack_98.order;
            local_308._M_string_length._4_4_ = TStack_98.type;
            local_30c[0] = 0;
            local_30c[1] = 0;
            local_30c[2] = 0;
            local_30c[3] = 0;
            lVar11 = 0;
            do {
              local_30c[lVar11] =
                   *(uint *)((long)&local_308._M_dataplus._M_p + lVar11 * 4) <
                   *(uint *)(local_248 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            local_31c[0] = 0;
            local_31c[1] = 0;
            local_31c[2] = 0;
            local_31c[3] = 0;
            lVar11 = 0;
            do {
              local_31c[lVar11] = local_30c[lVar11] & local_90.m_data[lVar11];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            if (local_31c[0] == 0) {
              uVar12 = 0xffffffffffffffff;
              do {
                if (uVar12 == 2) {
                  uVar13 = 3;
                  break;
                }
                uVar13 = uVar12 + 1;
                lVar11 = uVar12 + 2;
                uVar12 = uVar13;
              } while (local_31c[lVar11] != 1);
              if (uVar13 < 3) goto LAB_0066a7c0;
            }
            else {
LAB_0066a7c0:
              bVar9 = tcu::isGatherResultValid
                                ((TextureCubeView *)local_250,&local_88,
                                 (IntLookupPrecision *)local_b8,(Vec3 *)local_2b0,componentNdx,
                                 (UVec4 *)local_2d8);
              if (!bVar9) {
                *(undefined4 *)((long)local_280 + (long)(int)((int)local_288 * CVar22 + CVar21) * 4)
                     = 0xff0000ff;
                local_320 = 0;
              }
            }
            CVar21 = CVar21 + A;
          } while (CVar21 != CVar6);
          CVar22 = CVar22 + A;
          uVar20 = local_320;
        } while (CVar22 != CVar6);
      }
      bVar18 = (byte)uVar20;
      local_2c8._M_allocated_capacity._0_4_ = 0x69726556;
      local_2c8._M_allocated_capacity._4_4_ = 0x65527966;
      local_2c8._8_4_ = 0x746c7573;
      local_2d0.order = sR;
      local_2d0.type = SNORM_INT8;
      local_2c8._M_local_buf[0xc] = '\0';
      local_348 = (undefined1  [8])&local_338;
      local_1b8.m_name._M_dataplus._M_p = (pointer)0x13;
      local_2d8 = (undefined1  [8])&local_2c8;
      local_348 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_348,(ulong)&local_1b8);
      local_338._M_allocated_capacity = (size_type)local_1b8.m_name._M_dataplus._M_p;
      *(undefined8 *)local_348 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_348 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_348 + 0xf),"sult",4);
      TStack_340 = (TextureFormat)local_1b8.m_name._M_dataplus._M_p;
      *(char *)((long)local_348 + (long)local_1b8.m_name._M_dataplus._M_p) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)local_248,(string *)local_2d8,(string *)local_348);
      tcu::TestLog::startImageSet(local_318,(char *)local_248._0_8_,(char *)local_248._32_8_);
      paVar1 = &local_308.field_2;
      local_308.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_308.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_308._M_string_length._0_4_ = RGBA;
      local_308._M_string_length._4_4_ = SNORM_INT8;
      local_308.field_2._M_local_buf[8] = '\0';
      local_2a0._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_2a0._M_allocated_capacity._6_2_ = 0x6465;
      local_2a0._8_2_ = 0x6920;
      local_2a0._10_4_ = 0x6567616d;
      local_2a8 = (ConstPixelBufferAccess *)0xe;
      local_2a0._M_local_buf[0xe] = '\0';
      pCVar14 = local_290;
      local_308._M_dataplus._M_p = (pointer)paVar1;
      local_2b0 = (undefined1  [8])&local_2a0;
      tcu::LogImage::LogImage
                (&local_1b8,&local_308,(string *)local_2b0,local_290,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write(&local_1b8,(int)local_318,__buf_05,(size_t)pCVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.m_description._M_dataplus._M_p != &local_1b8.m_description.field_2) {
        operator_delete(local_1b8.m_description._M_dataplus._M_p,
                        local_1b8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.m_name._M_dataplus._M_p != &local_1b8.m_name.field_2) {
        operator_delete(local_1b8.m_name._M_dataplus._M_p,
                        local_1b8.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_2b0 != (undefined1  [8])&local_2a0) {
        operator_delete((void *)local_2b0,
                        CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                 local_2a0._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != paVar1) {
        operator_delete(local_308._M_dataplus._M_p,
                        CONCAT26(local_308.field_2._M_allocated_capacity._6_2_,
                                 local_308.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((ConstPixelBufferAccess *)local_248._32_8_ != (ConstPixelBufferAccess *)(local_248 + 0x30)
         ) {
        operator_delete((void *)local_248._32_8_,(ulong)(local_248._48_8_ + 1));
      }
      if (local_248._0_8_ != (long)local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
      }
      if (local_348 != (undefined1  [8])&local_338) {
        operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
      }
      if (local_2d8 != (undefined1  [8])&local_2c8) {
        operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
      }
      if ((uVar20 & 1) == 0) {
        local_348 = (undefined1  [8])&local_338;
        local_338._M_allocated_capacity = 0x636e657265666552;
        local_338._8_2_ = 0x65;
        TStack_340.order = ARGB;
        TStack_340.type = SNORM_INT8;
        local_248._0_4_ = CHANNELORDER_LAST;
        local_248._4_4_ = SNORM_INT8;
        local_308._M_dataplus._M_p = (pointer)paVar1;
        local_308._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_308,(ulong)local_248);
        local_308.field_2._M_allocated_capacity._0_6_ = (undefined6)local_248._0_8_;
        local_308.field_2._M_allocated_capacity._6_2_ = SUB82(local_248._0_8_,6);
        *(undefined8 *)local_308._M_dataplus._M_p = 0x6572206c61656449;
        builtin_strncpy((char *)((long)local_308._M_dataplus._M_p + 8),"ference ",8);
        builtin_strncpy((char *)((long)local_308._M_dataplus._M_p + 0xd),"ce image",8);
        local_308._M_string_length = local_248._0_8_;
        *(char *)((long)local_308._M_dataplus._M_p + local_248._0_8_) = '\0';
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_2d8,&local_100);
        pCVar14 = (ConstPixelBufferAccess *)local_2d8;
        tcu::LogImage::LogImage
                  (&local_1b8,(string *)local_348,&local_308,pCVar14,QP_IMAGE_COMPRESSION_MODE_BEST)
        ;
        tcu::LogImage::write(&local_1b8,(int)local_318,__buf_06,(size_t)pCVar14);
        local_2a0._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_2a0._M_allocated_capacity._6_2_ = 0x7361;
        local_2a0._8_2_ = 0x6b;
        local_2a8 = (ConstPixelBufferAccess *)0x9;
        local_260._M_allocated_capacity = 0x616d20726f727245;
        local_260._8_2_ = 0x6b73;
        local_268 = (void *)0xa;
        local_260._M_local_buf[10] = '\0';
        pSVar15 = (Surface *)&local_288;
        local_2b0 = (undefined1  [8])&local_2a0;
        local_270 = (undefined1  [8])&local_260;
        tcu::LogImage::LogImage
                  ((LogImage *)local_248,(string *)local_2b0,(string *)local_270,pSVar15,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_248,(int)local_318,__buf_07,(size_t)pSVar15);
        if ((ConstPixelBufferAccess *)local_248._32_8_ !=
            (ConstPixelBufferAccess *)(local_248 + 0x30)) {
          operator_delete((void *)local_248._32_8_,(ulong)(local_248._48_8_ + 1));
        }
        if (local_248._0_8_ != (long)local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
        }
        if (local_270 != (undefined1  [8])&local_260) {
          operator_delete((void *)local_270,local_260._M_allocated_capacity + 1);
        }
        if (local_2b0 != (undefined1  [8])&local_2a0) {
          operator_delete((void *)local_2b0,
                          CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                   local_2a0._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.m_description._M_dataplus._M_p != &local_1b8.m_description.field_2) {
          operator_delete(local_1b8.m_description._M_dataplus._M_p,
                          local_1b8.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.m_name._M_dataplus._M_p != &local_1b8.m_name.field_2) {
          operator_delete(local_1b8.m_name._M_dataplus._M_p,
                          local_1b8.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != paVar1) {
          operator_delete(local_308._M_dataplus._M_p,
                          CONCAT26(local_308.field_2._M_allocated_capacity._6_2_,
                                   local_308.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if (local_348 != (undefined1  [8])&local_338) {
          operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
        }
      }
      tcu::TestLog::endImageSet(local_318);
    }
    else {
      local_b8._0_4_ = CVar22;
      local_b8._4_4_ = CVar22;
      local_b8._8_4_ = iVar23;
      local_b8._12_4_ = iVar19;
      local_b8._16_4_ = iVar19;
      local_b8._20_4_ = iVar17;
      if (2 < uVar20 - 0x1b) goto LAB_0066bde6;
      CVar6 = (local_290->m_size).m_data[0];
      tcu::TextureLevel::TextureLevel(&local_100,&local_290->m_format,CVar6,CVar6,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_128,&local_100);
      tcu::Surface::Surface((Surface *)&local_288,CVar6,CVar6);
      local_248._0_4_ = RGBA;
      local_248._4_4_ = UNORM_INT8;
      if (local_278 != (void *)0x0) {
        local_278 = local_280;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_1b8,(TextureFormat *)local_248,(int)local_288,
                 local_288._4_4_,1,local_278);
      local_2d8._0_4_ = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)local_248);
      tcu::clear((PixelBufferAccess *)&local_1b8,(Vec4 *)local_248);
      if ((int)CVar6 < 1) {
        uVar20 = 1;
      }
      else {
        local_2dc = (float)(int)CVar6;
        local_320 = (uint)CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
        CVar22 = R;
        do {
          local_310 = (float)(int)CVar22;
          CVar21 = R;
          do {
            local_1b8.m_name.field_2._M_allocated_capacity = 0;
            local_1b8.m_name.field_2._8_8_ = 0;
            local_1b8.m_name._M_dataplus._M_p = (pointer)0x0;
            local_1b8.m_name._M_string_length._0_4_ = R;
            local_1b8.m_name._M_string_length._4_4_ = SNORM_INT8;
            local_248._4_4_ = CVar22;
            local_248._0_4_ = CVar21;
            (**pPVar8->_vptr_PixelOffsets)(pPVar8,(TextureCubeView *)local_248,&local_1b8);
            local_2d8._4_4_ = local_310;
            local_2d8._0_4_ = (float)(int)CVar21;
            local_248._0_4_ = R;
            local_248._4_4_ = SNORM_INT8;
            lVar11 = 0;
            do {
              *(float *)(local_248 + lVar11 * 4) = *(float *)(local_2d8 + lVar11 * 4) + 0.5;
              lVar11 = lVar11 + 1;
            } while (lVar11 == 1);
            local_348._4_4_ = local_2dc;
            local_348._0_4_ = local_2dc;
            local_270 = (undefined1  [8])0x0;
            lVar11 = 0;
            do {
              *(float *)(local_270 + lVar11 * 4) =
                   *(float *)(local_248 + lVar11 * 4) / *(float *)(local_348 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 == 1);
            triQuadInterpolate<tcu::Vector<float,3>>
                      ((_anonymous_namespace_ *)local_2b0,local_d8,(float)local_270._0_4_,
                       (float)local_270._4_4_);
            tcu::ConstPixelBufferAccess::getPixelT<int>
                      ((ConstPixelBufferAccess *)local_2d8,(int)local_290,CVar21,CVar22);
            tcu::TextureCubeView::gather
                      ((TextureCubeView *)local_248,local_250,(float)local_2b0._0_4_,
                       (float)local_2b0._4_4_,local_2a8._0_4_,(int)&local_88);
            local_348._0_4_ = R;
            local_348._4_4_ = SNORM_INT8;
            TStack_340.order = R;
            TStack_340.type = SNORM_INT8;
            lVar11 = 0;
            do {
              *(int *)(local_348 + lVar11 * 4) = (int)*(float *)(local_248 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_128,(IVec4 *)local_348,CVar21,CVar22,0);
            local_248._0_4_ = R;
            local_248._4_4_ = SNORM_INT8;
            local_248._8_8_ = (ConstPixelBufferAccess *)0x0;
            lVar11 = 0;
            do {
              iVar23 = *(int *)(local_2d8 + lVar11 * 4);
              iVar19 = *(int *)(local_348 + lVar11 * 4);
              iVar17 = iVar23 - iVar19;
              if (iVar23 - iVar19 == 0 || iVar23 < iVar19) {
                iVar17 = -(iVar23 - iVar19);
              }
              *(int *)(local_248 + lVar11 * 4) = iVar17;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            local_308._M_dataplus._M_p = (pointer)local_a0;
            local_308._M_string_length._0_4_ = TStack_98.order;
            local_308._M_string_length._4_4_ = TStack_98.type;
            local_30c[0] = 0;
            local_30c[1] = 0;
            local_30c[2] = 0;
            local_30c[3] = 0;
            lVar11 = 0;
            do {
              local_30c[lVar11] =
                   *(int *)((long)&local_308._M_dataplus._M_p + lVar11 * 4) <
                   *(int *)(local_248 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            local_31c[0] = 0;
            local_31c[1] = 0;
            local_31c[2] = 0;
            local_31c[3] = 0;
            lVar11 = 0;
            do {
              local_31c[lVar11] = local_30c[lVar11] & local_90.m_data[lVar11];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            if (local_31c[0] == 0) {
              uVar12 = 0xffffffffffffffff;
              do {
                if (uVar12 == 2) {
                  uVar13 = 3;
                  break;
                }
                uVar13 = uVar12 + 1;
                lVar11 = uVar12 + 2;
                uVar12 = uVar13;
              } while (local_31c[lVar11] != 1);
              if (uVar13 < 3) goto LAB_0066bd70;
            }
            else {
LAB_0066bd70:
              bVar9 = tcu::isGatherResultValid
                                ((TextureCubeView *)local_250,&local_88,
                                 (IntLookupPrecision *)local_b8,(Vec3 *)local_2b0,componentNdx,
                                 (IVec4 *)local_2d8);
              if (!bVar9) {
                *(undefined4 *)((long)local_280 + (long)(int)((int)local_288 * CVar22 + CVar21) * 4)
                     = 0xff0000ff;
                local_320 = 0;
              }
            }
            CVar21 = CVar21 + A;
          } while (CVar21 != CVar6);
          CVar22 = CVar22 + A;
          uVar20 = local_320;
        } while (CVar22 != CVar6);
      }
      bVar18 = (byte)uVar20;
      local_2c8._M_allocated_capacity._0_4_ = 0x69726556;
      local_2c8._M_allocated_capacity._4_4_ = 0x65527966;
      local_2c8._8_4_ = 0x746c7573;
      local_2d0.order = sR;
      local_2d0.type = SNORM_INT8;
      local_2c8._M_local_buf[0xc] = '\0';
      local_348 = (undefined1  [8])&local_338;
      local_1b8.m_name._M_dataplus._M_p = (pointer)0x13;
      local_2d8 = (undefined1  [8])&local_2c8;
      local_348 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_348,(ulong)&local_1b8);
      local_338._M_allocated_capacity = (size_type)local_1b8.m_name._M_dataplus._M_p;
      *(undefined8 *)local_348 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_348 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_348 + 0xf),"sult",4);
      TStack_340 = (TextureFormat)local_1b8.m_name._M_dataplus._M_p;
      *(char *)((long)local_348 + (long)local_1b8.m_name._M_dataplus._M_p) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)local_248,(string *)local_2d8,(string *)local_348);
      tcu::TestLog::startImageSet(local_318,(char *)local_248._0_8_,(char *)local_248._32_8_);
      paVar1 = &local_308.field_2;
      local_308.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_308.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_308._M_string_length._0_4_ = RGBA;
      local_308._M_string_length._4_4_ = SNORM_INT8;
      local_308.field_2._M_local_buf[8] = '\0';
      local_2a0._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_2a0._M_allocated_capacity._6_2_ = 0x6465;
      local_2a0._8_2_ = 0x6920;
      local_2a0._10_4_ = 0x6567616d;
      local_2a8 = (ConstPixelBufferAccess *)0xe;
      local_2a0._M_local_buf[0xe] = '\0';
      pCVar14 = local_290;
      local_308._M_dataplus._M_p = (pointer)paVar1;
      local_2b0 = (undefined1  [8])&local_2a0;
      tcu::LogImage::LogImage
                (&local_1b8,&local_308,(string *)local_2b0,local_290,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write(&local_1b8,(int)local_318,__buf_08,(size_t)pCVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.m_description._M_dataplus._M_p != &local_1b8.m_description.field_2) {
        operator_delete(local_1b8.m_description._M_dataplus._M_p,
                        local_1b8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.m_name._M_dataplus._M_p != &local_1b8.m_name.field_2) {
        operator_delete(local_1b8.m_name._M_dataplus._M_p,
                        local_1b8.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_2b0 != (undefined1  [8])&local_2a0) {
        operator_delete((void *)local_2b0,
                        CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                 local_2a0._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != paVar1) {
        operator_delete(local_308._M_dataplus._M_p,
                        CONCAT26(local_308.field_2._M_allocated_capacity._6_2_,
                                 local_308.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((ConstPixelBufferAccess *)local_248._32_8_ != (ConstPixelBufferAccess *)(local_248 + 0x30)
         ) {
        operator_delete((void *)local_248._32_8_,(ulong)(local_248._48_8_ + 1));
      }
      if (local_248._0_8_ != (long)local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
      }
      if (local_348 != (undefined1  [8])&local_338) {
        operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
      }
      if (local_2d8 != (undefined1  [8])&local_2c8) {
        operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
      }
      if ((uVar20 & 1) == 0) {
        local_348 = (undefined1  [8])&local_338;
        local_338._M_allocated_capacity = 0x636e657265666552;
        local_338._8_2_ = 0x65;
        TStack_340.order = ARGB;
        TStack_340.type = SNORM_INT8;
        local_248._0_4_ = CHANNELORDER_LAST;
        local_248._4_4_ = SNORM_INT8;
        local_308._M_dataplus._M_p = (pointer)paVar1;
        local_308._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_308,(ulong)local_248);
        local_308.field_2._M_allocated_capacity._0_6_ = (undefined6)local_248._0_8_;
        local_308.field_2._M_allocated_capacity._6_2_ = SUB82(local_248._0_8_,6);
        *(undefined8 *)local_308._M_dataplus._M_p = 0x6572206c61656449;
        builtin_strncpy((char *)((long)local_308._M_dataplus._M_p + 8),"ference ",8);
        builtin_strncpy((char *)((long)local_308._M_dataplus._M_p + 0xd),"ce image",8);
        local_308._M_string_length = local_248._0_8_;
        *(char *)((long)local_308._M_dataplus._M_p + local_248._0_8_) = '\0';
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_2d8,&local_100);
        pCVar14 = (ConstPixelBufferAccess *)local_2d8;
        tcu::LogImage::LogImage
                  (&local_1b8,(string *)local_348,&local_308,pCVar14,QP_IMAGE_COMPRESSION_MODE_BEST)
        ;
        tcu::LogImage::write(&local_1b8,(int)local_318,__buf_09,(size_t)pCVar14);
        local_2a0._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_2a0._M_allocated_capacity._6_2_ = 0x7361;
        local_2a0._8_2_ = 0x6b;
        local_2a8 = (ConstPixelBufferAccess *)0x9;
        local_260._M_allocated_capacity = 0x616d20726f727245;
        local_260._8_2_ = 0x6b73;
        local_268 = (void *)0xa;
        local_260._M_local_buf[10] = '\0';
        pSVar15 = (Surface *)&local_288;
        local_2b0 = (undefined1  [8])&local_2a0;
        local_270 = (undefined1  [8])&local_260;
        tcu::LogImage::LogImage
                  ((LogImage *)local_248,(string *)local_2b0,(string *)local_270,pSVar15,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_248,(int)local_318,__buf_10,(size_t)pSVar15);
        if ((ConstPixelBufferAccess *)local_248._32_8_ !=
            (ConstPixelBufferAccess *)(local_248 + 0x30)) {
          operator_delete((void *)local_248._32_8_,(ulong)(local_248._48_8_ + 1));
        }
        if (local_248._0_8_ != (long)local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
        }
        if (local_270 != (undefined1  [8])&local_260) {
          operator_delete((void *)local_270,local_260._M_allocated_capacity + 1);
        }
        if (local_2b0 != (undefined1  [8])&local_2a0) {
          operator_delete((void *)local_2b0,
                          CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                   local_2a0._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.m_description._M_dataplus._M_p != &local_1b8.m_description.field_2) {
          operator_delete(local_1b8.m_description._M_dataplus._M_p,
                          local_1b8.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.m_name._M_dataplus._M_p != &local_1b8.m_name.field_2) {
          operator_delete(local_1b8.m_name._M_dataplus._M_p,
                          local_1b8.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != paVar1) {
          operator_delete(local_308._M_dataplus._M_p,
                          CONCAT26(local_308.field_2._M_allocated_capacity._6_2_,
                                   local_308.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if (local_348 != (undefined1  [8])&local_338) {
          operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
        }
      }
      tcu::TestLog::endImageSet(local_318);
    }
  }
  tcu::Surface::~Surface((Surface *)&local_288);
  tcu::TextureLevel::~TextureLevel(&local_100);
LAB_0066b9ff:
  if (local_d0.
      super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
      .m_data.ptr != (PixelOffsets *)0x0) {
    (*(local_d0.
       super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
       .m_data.ptr)->_vptr_PixelOffsets[2])();
  }
  return (bool)(bVar18 & 1);
}

Assistant:

bool TextureGatherInstance::verify (const ConstPixelBufferAccess&	rendered,
								const TexViewT&					texture,
								const TexCoordT					(&texCoords)[4],
								const GatherArgs&				gatherArgs) const
{
	TestLog& log = m_context.getTestContext().getLog();

	{
		DE_ASSERT(m_colorBufferFormat.order == tcu::TextureFormat::RGBA);
		DE_ASSERT(m_colorBufferFormat.type == tcu::TextureFormat::UNORM_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT8);

		const MovePtr<PixelOffsets>		pixelOffsets	= makePixelOffsetsFunctor(m_baseParams.gatherType, gatherArgs, getOffsetRange(m_baseParams.offsetSize, m_context.getDeviceProperties().limits));
		const tcu::PixelFormat			pixelFormat		= tcu::PixelFormat(8,8,8,8);
		const IVec4						colorBits		= tcu::max(TextureTestUtil::getBitsVec(pixelFormat) - 1, tcu::IVec4(0));
		const IVec3						coordBits		= m_baseParams.textureType == TEXTURETYPE_2D			? IVec3(20,20,0)
														: m_baseParams.textureType == TEXTURETYPE_CUBE			? IVec3(10,10,10)
														: m_baseParams.textureType == TEXTURETYPE_2D_ARRAY		? IVec3(20,20,20)
														: IVec3(-1);
		const IVec3						uvwBits			= m_baseParams.textureType == TEXTURETYPE_2D			? IVec3(7,7,0)
														: m_baseParams.textureType == TEXTURETYPE_CUBE			? IVec3(6,6,0)
														: m_baseParams.textureType == TEXTURETYPE_2D_ARRAY		? IVec3(7,7,7)
														: IVec3(-1);
		tcu::Sampler					sampler;
		sampler.wrapS		= m_baseParams.wrapS;
		sampler.wrapT		= m_baseParams.wrapT;
		sampler.compare		= m_baseParams.shadowCompareMode;

		if (isDepthFormat(m_baseParams.textureFormat))
		{
			tcu::TexComparePrecision comparePrec;
			comparePrec.coordBits		= coordBits;
			comparePrec.uvwBits			= uvwBits;
			comparePrec.referenceBits	= 16;
			comparePrec.resultBits		= pixelFormat.redBits-1;

			return verifyGatherOffsetsCompare(log, rendered, texture, texCoords, sampler, comparePrec, PixelCompareRefZDefault(RENDER_SIZE), *pixelOffsets);
		}
		else
		{
			const int componentNdx = de::max(0, gatherArgs.componentNdx);

			if (isUnormFormatType(m_baseParams.textureFormat.type))
			{
				tcu::LookupPrecision lookupPrec;
				lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(colorBits);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= TextureTestUtil::getCompareMask(pixelFormat);
				return verifyGatherOffsets<float>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
			}
			else if (isUIntFormatType(m_baseParams.textureFormat.type) || isSIntFormatType(m_baseParams.textureFormat.type))
			{
				tcu::IntLookupPrecision		lookupPrec;
				lookupPrec.colorThreshold	= UVec4(0);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= TextureTestUtil::getCompareMask(pixelFormat);

				if (isUIntFormatType(m_baseParams.textureFormat.type))
					return verifyGatherOffsets<deUint32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else if (isSIntFormatType(m_baseParams.textureFormat.type))
					return verifyGatherOffsets<deInt32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else
				{
					DE_ASSERT(false);
					return false;
				}
			}
			else
			{
				DE_ASSERT(false);
				return false;
			}
		}
	}
}